

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O3

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_command_queue_flag_t flags)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  size_type *psVar5;
  char *pcVar6;
  ulong uVar7;
  ze_command_queue_flag_t __val;
  char *pcVar8;
  uint __len;
  string __str;
  long *local_50 [2];
  long local_40 [2];
  
  if (flags == ZE_COMMAND_QUEUE_FLAG_FORCE_UINT32) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_COMMAND_QUEUE_FLAG_FORCE_UINT32";
    pcVar6 = "";
  }
  else if (flags == ZE_COMMAND_QUEUE_FLAG_EXPLICIT_ONLY) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_COMMAND_QUEUE_FLAG_EXPLICIT_ONLY";
    pcVar6 = "";
  }
  else {
    if (flags != 0) {
      __val = -flags;
      if (0 < (int)flags) {
        __val = flags;
      }
      __len = 1;
      if (9 < __val) {
        uVar7 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar4 = (uint)uVar7;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_001076e0;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_001076e0;
          }
          if (uVar4 < 10000) goto LAB_001076e0;
          uVar7 = uVar7 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_001076e0:
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)flags >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(flags >> 0x1f) + (long)local_50[0]),__len,__val);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x10c348);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar5) {
        lVar1 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_50[0] == local_40) {
        return __return_storage_ptr__;
      }
      operator_delete(local_50[0],local_40[0] + 1);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "Default";
    pcVar6 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_command_queue_flag_t flags) {
  if (flags == 0) {
    return "Default";
  } else if (flags == ZE_COMMAND_QUEUE_FLAG_EXPLICIT_ONLY) {
    return "ZE_COMMAND_QUEUE_FLAG_EXPLICIT_ONLY";
  } else if (flags == ZE_COMMAND_QUEUE_FLAG_FORCE_UINT32) {
    return "ZE_COMMAND_QUEUE_FLAG_FORCE_UINT32";
  } else {
    return "Unknown ze_command_queue_flag_t value: " +
           std::to_string(static_cast<int>(flags));
  }
}